

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void musig_test_vectors_noncegen(void)

{
  int iVar1;
  secp256k1_xonly_pubkey aggpk;
  secp256k1_keyagg_cache_internal cache_i;
  uchar pubnonce66 [66];
  secp256k1_pubkey pk;
  uchar *extra_in;
  uchar *msg;
  uchar *sk;
  secp256k1_musig_pubnonce pubnonce;
  secp256k1_musig_secnonce secnonce;
  uchar session_secrand32 [32];
  secp256k1_musig_keyagg_cache *keyagg_cache_ptr;
  secp256k1_musig_keyagg_cache keyagg_cache;
  musig_nonce_gen_test_case *c;
  musig_nonce_gen_vector *vector;
  size_t i;
  secp256k1_keyagg_cache_internal *in_stack_fffffffffffffbf8;
  secp256k1_context *in_stack_fffffffffffffc00;
  secp256k1_pubkey *in_stack_fffffffffffffc10;
  uchar *in_stack_fffffffffffffc18;
  uchar *in_stack_fffffffffffffc20;
  secp256k1_musig_pubnonce *in_stack_fffffffffffffc28;
  secp256k1_musig_secnonce *in_stack_fffffffffffffc30;
  secp256k1_context *in_stack_fffffffffffffc38;
  uchar *in_stack_fffffffffffffc50;
  secp256k1_musig_keyagg_cache *in_stack_fffffffffffffc58;
  secp256k1_pubkey *in_stack_fffffffffffffc60;
  secp256k1_context *in_stack_fffffffffffffc68;
  uchar *in_stack_fffffffffffffc78;
  secp256k1_xonly_pubkey *in_stack_fffffffffffffc80;
  secp256k1_context *in_stack_fffffffffffffc88;
  secp256k1_musig_pubnonce *in_stack_fffffffffffffcb8;
  uchar *in_stack_fffffffffffffcc0;
  secp256k1_context *in_stack_fffffffffffffcc8;
  undefined1 local_2b8 [80];
  undefined1 local_268 [64];
  uchar *local_228;
  secp256k1_keyagg_cache_internal *local_220;
  uchar *local_218;
  undefined1 auStack_188 [64];
  undefined1 auStack_148 [64];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  secp256k1_context *local_e8;
  undefined1 local_dd [213];
  ulong local_8;
  
  local_dd._205_8_ = &musig_nonce_gen_vector;
  local_8 = 0;
  while( true ) {
    if (1 < local_8) {
      return;
    }
    local_dd._197_8_ = (musig_nonce_gen_test_case *)local_dd._205_8_ + local_8;
    local_e8 = (secp256k1_context *)0x0;
    local_218 = (uchar *)0x0;
    local_220 = (secp256k1_keyagg_cache_internal *)0x0;
    local_228 = (uchar *)0x0;
    local_108 = *(undefined8 *)((musig_nonce_gen_test_case *)local_dd._197_8_)->rand_;
    local_100 = *(undefined8 *)(((musig_nonce_gen_test_case *)local_dd._197_8_)->rand_ + 8);
    local_f8 = *(undefined8 *)(((musig_nonce_gen_test_case *)local_dd._197_8_)->rand_ + 0x10);
    local_f0 = *(undefined8 *)(((musig_nonce_gen_test_case *)local_dd._197_8_)->rand_ + 0x18);
    if (((musig_nonce_gen_test_case *)local_dd._197_8_)->has_sk != 0) {
      local_218 = ((musig_nonce_gen_test_case *)local_dd._197_8_)->sk;
    }
    if (((musig_nonce_gen_test_case *)local_dd._197_8_)->has_aggpk != 0) {
      memset(&stack0xfffffffffffffc50,0,0xf8);
      iVar1 = secp256k1_xonly_pubkey_parse
                        (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
                         in_stack_fffffffffffffc78);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/tests_impl.h"
                ,0x31d,"test condition failed: secp256k1_xonly_pubkey_parse(CTX, &aggpk, c->aggpk)")
        ;
        abort();
      }
      iVar1 = secp256k1_xonly_pubkey_load
                        (in_stack_fffffffffffffc00,&in_stack_fffffffffffffbf8->pk,
                         (secp256k1_xonly_pubkey *)0x1644aa);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/tests_impl.h"
                ,0x31e,
                "test condition failed: secp256k1_xonly_pubkey_load(CTX, &cache_i.pk, &aggpk)");
        abort();
      }
      secp256k1_keyagg_cache_save
                ((secp256k1_musig_keyagg_cache *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8
                );
      local_e8 = (secp256k1_context *)local_dd;
    }
    if (*(int *)(local_dd._197_8_ + 0x8c) != 0) {
      local_220 = (secp256k1_keyagg_cache_internal *)(local_dd._197_8_ + 0x90);
    }
    if (*(int *)(local_dd._197_8_ + 0xb0) != 0) {
      local_228 = (uchar *)(local_dd._197_8_ + 0xb4);
    }
    iVar1 = secp256k1_ec_pubkey_parse
                      (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                       in_stack_fffffffffffffc58->data,(size_t)in_stack_fffffffffffffc50);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/tests_impl.h"
              ,0x329,
              "test condition failed: secp256k1_ec_pubkey_parse(CTX, &pk, c->pk, sizeof(c->pk))");
      abort();
    }
    in_stack_fffffffffffffbf8 = local_220;
    in_stack_fffffffffffffc00 = local_e8;
    iVar1 = secp256k1_musig_nonce_gen
                      (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,in_stack_fffffffffffffc28
                       ,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                       in_stack_fffffffffffffc10,in_stack_fffffffffffffc50,in_stack_fffffffffffffc58
                       ,in_stack_fffffffffffffc60->data);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/tests_impl.h"
              ,0x32a,
              "test condition failed: secp256k1_musig_nonce_gen(CTX, &secnonce, &pubnonce, session_secrand32, sk, &pk, msg, keyagg_cache_ptr, extra_in) == 1"
             );
      abort();
    }
    iVar1 = secp256k1_memcmp_var(auStack_188,(uchar *)(local_dd._197_8_ + 0xd4),0x40);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/tests_impl.h"
              ,0x32b,
              "test condition failed: secp256k1_memcmp_var(&secnonce.data[4], c->expected_secnonce, 2*32) == 0"
             );
      abort();
    }
    iVar1 = secp256k1_memcmp_var(auStack_148,local_268,0x40);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/tests_impl.h"
              ,0x32e,
              "test condition failed: secp256k1_memcmp_var(&secnonce.data[4+2*32], &pk, sizeof(pk)) == 0"
             );
      abort();
    }
    iVar1 = secp256k1_memcmp_var
                      ((uchar *)(local_dd._197_8_ + 0xd4) + 0x40,(uchar *)(local_dd._197_8_ + 0x44),
                       0x21);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/tests_impl.h"
              ,0x32f,
              "test condition failed: secp256k1_memcmp_var(&c->expected_secnonce[2*32], c->pk, sizeof(c->pk)) == 0"
             );
      abort();
    }
    iVar1 = secp256k1_musig_pubnonce_serialize
                      (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8
                      );
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/tests_impl.h"
              ,0x331,
              "test condition failed: secp256k1_musig_pubnonce_serialize(CTX, pubnonce66, &pubnonce) == 1"
             );
      abort();
    }
    iVar1 = secp256k1_memcmp_var(local_2b8,(uchar *)(local_dd._197_8_ + 0x135),0x42);
    if (iVar1 != 0) break;
    local_8 = local_8 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/tests_impl.h"
          ,0x333,
          "test condition failed: secp256k1_memcmp_var(pubnonce66, c->expected_pubnonce, sizeof(pubnonce66)) == 0"
         );
  abort();
}

Assistant:

static void musig_test_vectors_noncegen(void) {
    size_t i;
    const struct musig_nonce_gen_vector *vector = &musig_nonce_gen_vector;

    for (i = 0; i < sizeof(vector->test_case)/sizeof(vector->test_case[0]); i++) {
        const struct musig_nonce_gen_test_case *c = &vector->test_case[i];
        secp256k1_musig_keyagg_cache keyagg_cache;
        secp256k1_musig_keyagg_cache *keyagg_cache_ptr = NULL;
        unsigned char session_secrand32[32];
        secp256k1_musig_secnonce secnonce;
        secp256k1_musig_pubnonce pubnonce;
        const unsigned char *sk = NULL;
        const unsigned char *msg = NULL;
        const unsigned char *extra_in = NULL;
        secp256k1_pubkey pk;
        unsigned char pubnonce66[66];

        memcpy(session_secrand32, c->rand_, 32);
        if (c->has_sk) {
            sk = c->sk;
        }
        if (c->has_aggpk) {
            /* Create keyagg_cache from aggpk */
            secp256k1_keyagg_cache_internal cache_i;
            secp256k1_xonly_pubkey aggpk;
            memset(&cache_i, 0, sizeof(cache_i));
            CHECK(secp256k1_xonly_pubkey_parse(CTX, &aggpk, c->aggpk));
            CHECK(secp256k1_xonly_pubkey_load(CTX, &cache_i.pk, &aggpk));
            secp256k1_keyagg_cache_save(&keyagg_cache, &cache_i);
            keyagg_cache_ptr = &keyagg_cache;
        }
        if (c->has_msg) {
            msg = c->msg;
        }
        if (c->has_extra_in) {
            extra_in = c->extra_in;
        }

        CHECK(secp256k1_ec_pubkey_parse(CTX, &pk, c->pk, sizeof(c->pk)));
        CHECK(secp256k1_musig_nonce_gen(CTX, &secnonce, &pubnonce, session_secrand32, sk, &pk, msg, keyagg_cache_ptr, extra_in) == 1);
        CHECK(secp256k1_memcmp_var(&secnonce.data[4], c->expected_secnonce, 2*32) == 0);
        /* The last element of the secnonce is the public key (uncompressed in
         * secp256k1_musig_secnonce, compressed in the test vector secnonce). */
        CHECK(secp256k1_memcmp_var(&secnonce.data[4+2*32], &pk, sizeof(pk)) == 0);
        CHECK(secp256k1_memcmp_var(&c->expected_secnonce[2*32], c->pk, sizeof(c->pk)) == 0);

        CHECK(secp256k1_musig_pubnonce_serialize(CTX, pubnonce66, &pubnonce) == 1);
        CHECK(sizeof(c->expected_pubnonce) == sizeof(pubnonce66));
        CHECK(secp256k1_memcmp_var(pubnonce66, c->expected_pubnonce, sizeof(pubnonce66)) == 0);
    }
}